

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_wear_rings(void)

{
  bool bVar1;
  wchar_t wVar2;
  borg_item_conflict *pbVar3;
  char *what;
  _Bool fix;
  borg_item_conflict *item;
  int b_i;
  int i;
  int32_t b_p;
  int32_t p;
  int hole;
  
  wVar2 = borg_first_empty_inventory_slot();
  b_i = 0;
  item._0_4_ = -1;
  bVar1 = false;
  if (wVar2 == L'\xffffffff') {
    p._3_1_ = false;
  }
  else if (borg_items[(int)(z_info->pack_size + 3)].iqty == '\0') {
    if (borg_items[(int)(z_info->pack_size + 2)].iqty == '\0') {
      if (wVar2 + L'\x01' < (int)((uint)z_info->pack_size - borg.trait[0x9e])) {
        if (borg_items[wVar2 + L'\x01'].iqty == '\0') {
          if ((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) {
            if (borg_t - borg_began < 0x7d1) {
              for (item._4_4_ = 0; item._4_4_ < (int)(uint)z_info->pack_size;
                  item._4_4_ = item._4_4_ + 1) {
                pbVar3 = borg_items + item._4_4_;
                if (((((pbVar3->iqty != '\0') && ((pbVar3->aware & 1U) != 0)) &&
                     (pbVar3->value != 0)) &&
                    (((((player->opts).opt[0x1e] & 1U) == 0 || ((pbVar3->ident & 1U) != 0)) ||
                     (pbVar3->art_idx == '\0')))) && (pbVar3->tval == '\x15')) {
                  memcpy(borg_items + (int)(z_info->pack_size + 3),pbVar3,0x388);
                  borg_items[(int)(z_info->pack_size + 3)].iqty = '\x01';
                  pbVar3->iqty = pbVar3->iqty + 0xff;
                  bVar1 = true;
                  borg_notice(true);
                  i = borg_power();
                  if ((pbVar3->one_ring & 1U) != 0) {
                    i = borg.power << 1;
                  }
                  borg_items[(int)(z_info->pack_size + 3)].iqty = '\0';
                  pbVar3->iqty = pbVar3->iqty + '\x01';
                  if (((int)item < 0) || (b_i <= i)) {
                    item._0_4_ = item._4_4_;
                    b_i = i;
                  }
                }
              }
              if (bVar1) {
                borg_notice(true);
              }
              if (((int)item < 0) || (b_i <= borg.power)) {
                p._3_1_ = false;
              }
              else {
                pbVar3 = borg_items + (int)item;
                borg_note("# Putting on best tight ring.");
                what = format("# Wearing %s.",pbVar3);
                borg_note(what);
                borg_keypress(0x77);
                borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)item]);
                borg.time_this_panel = borg.time_this_panel + 1;
                p._3_1_ = true;
              }
            }
            else {
              p._3_1_ = false;
            }
          }
          else {
            p._3_1_ = false;
          }
        }
        else {
          p._3_1_ = false;
        }
      }
      else {
        p._3_1_ = false;
      }
    }
    else {
      p._3_1_ = false;
    }
  }
  else {
    p._3_1_ = false;
  }
  return p._3_1_;
}

Assistant:

bool borg_wear_rings(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t p, b_p = 0L;

    int i, b_i     = -1;

    borg_item *item;

    bool fix = false;

    if (hole == -1)
        return false;

    /* Require no rings */
    if (borg_items[INVEN_LEFT].iqty)
        return false;
    if (borg_items[INVEN_RIGHT].iqty)
        return false;

    /* Require two empty slots */
    if (hole + 1 >= PACK_SLOTS)
        return false;
    if (borg_items[hole + 1].iqty)
        return false;

    /* hack prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;

    /* Scan inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Hack -- ignore "worthless" items */
        if (!item->value)
            continue;

        /* skip artifact rings not star id'd  */
        if (OPT(player, birth_randarts) && !item->ident && item->art_idx)
            continue;

        /* Only process "rings" */
        if (item->tval != TV_RING)
            continue;

        /* Wear new item */
        memcpy(&borg_items[INVEN_LEFT], item, sizeof(borg_item));

        /* Only a single item */
        borg_items[INVEN_LEFT].iqty = 1;

        /* Reduce the inventory quantity by one */
        item->iqty--;

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        p = borg_power();

        /* the One Ring would be awesome */
        if (item->one_ring)
            p = borg.power * 2;

        /* Restore the old item (empty) */
        borg_items[INVEN_LEFT].iqty = 0;

        /* Restore the item in inventory */
        item->iqty++;

        /* Ignore "bad" swaps */
        if ((b_i >= 0) && (p < b_p))
            continue;

        /* Maintain the "best" */
        b_i = i;
        b_p = p;
    }

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* No item */
    if ((b_i >= 0) && (b_p > borg.power)) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Log */
        borg_note("# Putting on best tight ring.");

        /* Log */
        borg_note(format("# Wearing %s.", item->desc));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);

        /* Did something */
        borg.time_this_panel++;
        return true;
    }

    /* Nope */
    return false;
}